

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

void tvm::runtime::SaveBinaryToFile(string *file_name,string *data)

{
  ofstream fs;
  LogMessageFatal local_3a0;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)file_name,_S_out|_S_bin);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3a0,"Check failed: !fs.fail()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a0,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a0,"Cannot open ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3a0,(file_name->_M_dataplus)._M_p,file_name->_M_string_length);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_3a0);
  }
  std::ostream::write((char *)&local_218,(long)(data->_M_dataplus)._M_p);
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void SaveBinaryToFile(
    const std::string &file_name,
    const std::string &data) {
  std::ofstream fs(file_name, std::ios::out | std::ios::binary);
  CHECK(!fs.fail()) << "Cannot open " << file_name;
  fs.write(&data[0], data.length());
}